

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O1

void BYTE_OUT1R3(dill_stream s,int insn1,int rex,int insn2,int insn3,int insn4)

{
  char **ppcVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (s->p->code_limit <= s->p->cur_ip) {
    extend_dill_stream(s);
  }
  pcVar2 = s->p->cur_ip;
  *pcVar2 = (char)insn1;
  if (rex == 0) {
    lVar3 = 3;
    lVar4 = 2;
    lVar5 = 1;
  }
  else {
    pcVar2[1] = (byte)rex | 0x40;
    lVar3 = 4;
    lVar4 = 3;
    lVar5 = 2;
  }
  pcVar2[lVar5] = '\x0f';
  pcVar2[lVar4] = (char)insn2;
  pcVar2[lVar3] = (char)insn3;
  if (s->dill_debug != 0) {
    dump_cur_dill_insn(s);
  }
  ppcVar1 = &s->p->cur_ip;
  *ppcVar1 = *ppcVar1 + (5 - (ulong)(rex == 0));
  return;
}

Assistant:

static void
BYTE_OUT1R3(dill_stream s, int insn1, int rex, int insn2, int insn3, int insn4)
{
    unsigned char* tmp_ip;
    if (s->p->cur_ip >= s->p->code_limit) {
        extend_dill_stream(s);
    }
    tmp_ip = (unsigned char*)s->p->cur_ip;
    if (rex != 0) {
        *(tmp_ip + 0) = (unsigned char)insn1;
        *(tmp_ip + 1) = (unsigned char)rex | 0x40;
        *(tmp_ip + 2) = (unsigned char)insn2;
        *(tmp_ip + 3) = (unsigned char)insn3;
        *(tmp_ip + 4) = (unsigned char)insn4;
    } else {
        *(tmp_ip) = (unsigned char)insn1;
        *(tmp_ip + 1) = (unsigned char)insn2;
        *(tmp_ip + 2) = (unsigned char)insn3;
        *(tmp_ip + 3) = (unsigned char)insn4;
    }
    if (s->dill_debug)
        dump_cur_dill_insn(s);
    s->p->cur_ip = ((char*)s->p->cur_ip) + 4;
    if (rex != 0)
        s->p->cur_ip++;
}